

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O3

bool load_mpsLine(FILE *file,int *integerVar,int lmax,char *line,char *flag,double *data)

{
  int iVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  double dVar14;
  int iVar13;
  
  if (flag[1] == '\0') {
    pcVar4 = fgets(line,lmax,(FILE *)file);
    if (pcVar4 != (char *)0x0) {
      do {
        sVar5 = strlen(line);
        iVar13 = (int)sVar5;
        iVar11 = iVar13 + -1;
        lVar9 = -0x16;
        iVar12 = 0;
        do {
          iVar7 = iVar12;
          iVar1 = (int)lVar9;
          iVar3 = isspace((int)line[lVar9 + (long)iVar11 + 0x16]);
          iVar12 = iVar7 + 1;
          lVar9 = lVar9 + -1;
          if (iVar11 + iVar1 + 0x16 < 0) break;
        } while (iVar3 != 0);
        if ((0 < iVar13 - iVar12) && (*line != '*')) {
          uVar10 = lVar9 + sVar5 + 0x17;
          if ((int)uVar10 < 0x18) {
            memset(line + lVar9 + (sVar5 & 0xffffffff) + 0x17,0x20,
                   (ulong)(uint)-((int)lVar9 + iVar13) + 1);
            iVar12 = iVar11 - iVar7;
            do {
              iVar13 = iVar12;
              iVar12 = iVar13 + 1;
            } while (iVar12 < 0x17);
            uVar10 = (ulong)(iVar13 + 2);
          }
          if ((int)uVar10 == 0x18) {
            line[0x18] = '0';
            uVar10 = 0x19;
          }
          line[uVar10 & 0xffffffff] = '\0';
          if (*line != ' ') {
            *flag = *line;
            return false;
          }
          if ((((line[0xe] != '\'') || (line[0xf] != 'M')) || (line[0x10] != 'A')) ||
             (((line[0x11] != 'R' || (line[0x12] != 'K')) ||
              ((line[0x13] != 'E' || (line[0x14] != 'R')))))) {
            cVar2 = line[2];
            if (cVar2 == ' ') {
              cVar2 = line[1];
            }
            *flag = cVar2;
            data[1] = *(double *)(line + 4);
            data[2] = *(double *)(line + 0xe);
            dVar14 = atof(line + 0x18);
            *data = dVar14;
            if ((uint)uVar10 < 0x28) {
              return true;
            }
            flag[1] = '\x01';
            return true;
          }
          pcVar4 = line + (long)line[0x16] + 5;
          do {
            pcVar6 = pcVar4;
            pcVar4 = pcVar6 + 1;
          } while (pcVar6[-5] != '\'');
          if (((pcVar6[-4] == 'I') && (pcVar6[-3] == 'N')) &&
             (((pcVar6[-2] == 'T' &&
               (((pcVar6[-1] == 'O' && (*pcVar6 == 'R')) && (iVar12 = 1, *pcVar4 == 'G')))) ||
              ((((pcVar6[-2] == 'T' && (pcVar6[-1] == 'E')) && (*pcVar6 == 'N')) &&
               (iVar12 = 0, *pcVar4 == 'D')))))) {
            *integerVar = iVar12;
          }
        }
        pcVar4 = fgets(line,lmax,(FILE *)file);
      } while (pcVar4 != (char *)0x0);
    }
    bVar8 = false;
    printf("load_mpsLine: fgets_rt = %s\n",0);
  }
  else {
    flag[1] = '\0';
    data[2] = *(double *)(line + 0x27);
    dVar14 = atof(line + 0x31);
    *data = dVar14;
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool load_mpsLine(FILE *file, int& integerVar, int lmax, char *line, char *flag, double *data) {
    int F1 = 1, F2 = 4, F3 = 14, F4 = 24, F5 = 39, F6 = 49;
    char *fgets_rt;

    // check the buffer
    if (flag[1]) {
        flag[1] = 0;
        memcpy(&data[2], &line[F5], 8);
        data[0] = atof(&line[F6]);
        return true;
    }

    // try to read some to the line
    for (;;) {
        // Line input
        fgets_rt = fgets(line, lmax, file);
	if (fgets_rt == NULL) {
	  printf("load_mpsLine: fgets_rt = %s\n", fgets_rt);
	  return false;
	}
        // Line trim   -- to delete tailing white spaces
        int lcnt = strlen(line) - 1;
        while (isspace(line[lcnt]) && lcnt >= 0)
            lcnt--;
        if (lcnt <= 0 || line[0] == '*')
            continue;

        // Line expand -- to get data easier
        lcnt++;
        while (lcnt < F4)
            line[lcnt++] = ' '; // For row and bound row name
        if (lcnt == F4)
            line[lcnt++] = '0'; // For bound value
        line[lcnt] = '\0';

        // Done with section symbol
        if (line[0] != ' ') {
            flag[0] = line[0];
            return false;
        }

        if (line[F3] == '\'') {
	  if (line[F3+1] == 'M' && line[F3+2] == 'A' && line[F3+3] == 'R' &&
	      line[F3+4] == 'K' && line[F3+5] == 'E' && line[F3+6] == 'R') {
	    int cnter = line[F3+8];
	    while (line[cnter] != '\'')
	      ++cnter;
	    if (line[cnter+1] == 'I' && line[cnter+2] == 'N' && line[cnter+3] == 'T' &&
		line[cnter+4] == 'O' && line[cnter+5] == 'R' && line[cnter+6] == 'G')
	      integerVar = 1;
	    else if (line[cnter+1] == 'I' && line[cnter+2] == 'N' && line[cnter+3] == 'T' &&
		     line[cnter+4] == 'E' && line[cnter+5] == 'N' && line[cnter+6] == 'D')
	      integerVar = 0;
	    continue;
	  }
        }

        // Read major symbol & name
	flag[0] = line[F1 + 1] == ' ' ? line[F1] : line[F1 + 1];
	memcpy(&data[1], &line[F2], 8);
        // Read 1st minor name & value to output
        memcpy(&data[2], &line[F3], 8);
        data[0] = atof(&line[F4]);

        // Keep 2nd minor name & value for future
        if (lcnt > F5)
            flag[1] = 1;
        break;
    }

    return true;
}